

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::flip31(tetgenmesh *this,face *flipfaces,int flipflag)

{
  face *newface;
  int iVar1;
  int iVar2;
  shellface ppdVar3;
  shellface ppdVar4;
  shellface *pppdVar5;
  shellface ppdVar6;
  ulong *puVar7;
  shellface *pppdVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  shellface *pppdVar13;
  long lVar14;
  ulong uVar15;
  face bdedges [3];
  face bdsegs [3];
  face infaces [3];
  face outfaces [3];
  undefined8 uStack_110;
  face local_108;
  shellface *local_f8;
  int local_f0;
  shellface *local_e8;
  int local_e0;
  shellface local_d0;
  ulong uStack_c8;
  ulong auStack_c0 [4];
  long lStack_a0;
  ulong local_98;
  ulong local_90 [4];
  ulong uStack_70;
  ulong uStack_68;
  ulong auStack_60 [6];
  uint uVar12;
  
  lVar9 = 8;
  do {
    *(undefined8 *)((long)&uStack_110 + lVar9) = 0;
    *(undefined4 *)((long)&local_108.sh + lVar9) = 0;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x38);
  lVar9 = 8;
  do {
    *(undefined8 *)((long)&uStack_70 + lVar9) = 0;
    *(undefined4 *)((long)auStack_60 + lVar9 + -8) = 0;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x38);
  lVar9 = 8;
  do {
    *(undefined8 *)((long)&lStack_a0 + lVar9) = 0;
    *(undefined4 *)((long)local_90 + lVar9 + -8) = 0;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x38);
  lVar9 = 8;
  do {
    *(undefined8 *)((long)&local_d0 + lVar9) = 0;
    *(undefined4 *)((long)auStack_c0 + lVar9 + -8) = 0;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x38);
  ppdVar3 = flipfaces->sh[sdestpivot[flipfaces->shver]];
  ppdVar4 = flipfaces[1].sh[sdestpivot[flipfaces[1].shver]];
  local_d0 = flipfaces[2].sh[sdestpivot[flipfaces[2].shver]];
  this->flip31count = this->flip31count + 1;
  lVar9 = 0;
  do {
    pppdVar5 = flipfaces[lVar9].sh;
    (&local_108)[lVar9].sh = pppdVar5;
    iVar1 = snextpivot[flipfaces[lVar9].shver];
    (&local_108)[lVar9].shver = iVar1;
    lVar14 = (long)(iVar1 >> 1);
    ppdVar6 = pppdVar5[lVar14];
    uVar12 = (uint)ppdVar6;
    uVar11 = uVar12 & 7;
    *(uint *)(auStack_60 + lVar9 * 2) = uVar11;
    uVar10 = (ulong)ppdVar6 & 0xfffffffffffffff8;
    auStack_60[lVar9 * 2 + -1] = uVar10;
    local_90[lVar9 * 2 + -1] = uVar10;
    *(uint *)(local_90 + lVar9 * 2) = uVar11;
    ppdVar6 = pppdVar5[lVar14 + 6];
    *(uint *)(auStack_c0 + lVar9 * 2) = (uint)ppdVar6 & 7;
    auStack_c0[lVar9 * 2 + -1] = (ulong)ppdVar6 & 0xfffffffffffffff8;
    if (ppdVar6 != (shellface)0x0 && uVar10 != 0) {
      uVar10 = *(ulong *)(uVar10 + (ulong)(uVar12 & 6) * 4);
      if (pppdVar5 != (shellface *)(uVar10 & 0xfffffffffffffff8)) {
        pppdVar8 = (shellface *)(uVar10 & 0xfffffffffffffff8);
        do {
          pppdVar13 = pppdVar8;
          uVar11 = (uint)uVar10;
          uVar10 = *(ulong *)((long)pppdVar13 + (ulong)(uVar11 & 6) * 4);
          pppdVar8 = (shellface *)(uVar10 & 0xfffffffffffffff8);
        } while (pppdVar5 != (shellface *)(uVar10 & 0xfffffffffffffff8));
        local_90[lVar9 * 2 + -1] = (ulong)pppdVar13;
        *(uint *)(local_90 + lVar9 * 2) = uVar11 & 7;
      }
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  newface = flipfaces + 3;
  uStack_110._4_4_ = flipflag;
  makeshellface(this,this->subfaces,newface);
  iVar1 = flipfaces[3].shver;
  flipfaces[3].sh[sorgpivot[iVar1]] = ppdVar3;
  flipfaces[3].sh[sdestpivot[iVar1]] = ppdVar4;
  flipfaces[3].sh[sapexpivot[iVar1]] = local_d0;
  pppdVar5 = flipfaces->sh;
  local_108.sh = flipfaces[3].sh;
  *(undefined4 *)((long)local_108.sh + (long)this->shmarkindex * 4) =
       *(undefined4 *)((long)pppdVar5 + (long)this->shmarkindex * 4);
  if (this->checkconstraints != 0) {
    local_108.sh[this->areaboundindex] = pppdVar5[this->areaboundindex];
  }
  if (this->useinsertradius != 0) {
    *(undefined4 *)((long)local_108.sh + (long)this->shmarkindex * 4 + 8) =
         *(undefined4 *)((long)pppdVar5 + (long)this->shmarkindex * 4 + 8);
  }
  lVar9 = (long)this->pointmarkindex;
  iVar1 = flipfaces[3].shver;
  uVar10 = (ulong)iVar1;
  if ((*(uint *)((long)ppdVar3 + lVar9 * 4 + 4) & 0xffffff00) == 0x700) {
    ppdVar3[(long)this->point2simindex + 2] = (double *)((ulong)local_108.sh | uVar10);
    local_108.sh = newface->sh;
  }
  if ((*(uint *)((long)ppdVar4 + lVar9 * 4 + 4) & 0xffffff00) == 0x700) {
    ppdVar4[(long)this->point2simindex + 2] = (double *)((ulong)local_108.sh | uVar10);
    local_108.sh = newface->sh;
  }
  if ((*(uint *)((long)local_d0 + lVar9 * 4 + 4) & 0xffffff00) == 0x700) {
    local_d0[(long)this->point2simindex + 2] = (double *)((ulong)local_108.sh | uVar10);
    local_108.sh = newface->sh;
  }
  local_108.shver = iVar1;
  local_f8 = local_108.sh;
  local_f0 = snextpivot[uVar10];
  local_e8 = local_108.sh;
  local_e0 = snextpivot[snextpivot[uVar10]];
  lVar9 = (long)sorgpivot[0];
  lVar14 = 8;
  do {
    uVar10 = *(ulong *)((long)&uStack_70 + lVar14);
    puVar7 = *(ulong **)((long)&local_d0 + lVar14);
    if (uVar10 != 0) {
      if (puVar7 == (ulong *)0x0) {
        uVar15 = *(ulong *)((long)&uStack_110 + lVar14);
        uVar11 = *(uint *)((long)&local_108.sh + lVar14);
      }
      else {
        *(undefined4 *)((long)auStack_c0 + lVar14 + -8) = 0;
        uVar15 = *(ulong *)((long)&uStack_110 + lVar14);
        uVar11 = *(uint *)((long)&local_108.sh + lVar14);
        if (*(ulong *)(uVar15 + (long)sorgpivot[(int)uVar11] * 8) != puVar7[lVar9]) {
          uVar11 = uVar11 ^ 1;
          *(uint *)((long)&local_108.sh + lVar14) = uVar11;
        }
      }
      *(ulong *)(uVar15 + (long)((int)uVar11 >> 1) * 8) =
           (long)*(int *)((long)auStack_60 + lVar14 + -8) | uVar10;
      *(ulong *)(*(long *)((long)&lStack_a0 + lVar14) +
                (long)(*(int *)((long)local_90 + lVar14 + -8) >> 1) * 8) =
           (long)(int)uVar11 | uVar15;
    }
    if (puVar7 != (ulong *)0x0) {
      uVar10 = *(ulong *)((long)&uStack_110 + lVar14);
      iVar2 = *(int *)((long)&local_108.sh + lVar14);
      *(ulong *)(uVar10 + 0x30 + (long)(iVar2 >> 1) * 8) =
           (long)*(int *)((long)auStack_c0 + lVar14 + -8) | (ulong)puVar7;
      *puVar7 = (long)iVar2 | uVar10;
    }
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x38);
  (this->recentsh).sh = newface->sh;
  (this->recentsh).shver = iVar1;
  if (uStack_110._4_4_ != 0) {
    lVar9 = 0;
    do {
      flipshpush(this,(face *)((long)&local_108.sh + lVar9));
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x30);
  }
  return;
}

Assistant:

void tetgenmesh::flip31(face* flipfaces, int flipflag)
{
  face bdedges[3], outfaces[3], infaces[3];
  face bdsegs[3];
  face checkface;
  point pa, pb, pc;
  int i;

  pa = sdest(flipfaces[0]);
  pb = sdest(flipfaces[1]);
  pc = sdest(flipfaces[2]);

  flip31count++;

  // Collect all infos at the three boundary edges.
  for (i = 0; i < 3; i++) {
    senext(flipfaces[i], bdedges[i]);
    spivot(bdedges[i], outfaces[i]);
    infaces[i] = outfaces[i];
    sspivot(bdedges[i], bdsegs[i]);
    if (outfaces[i].sh != NULL) {
      if (isshsubseg(bdedges[i])) {
        spivot(infaces[i], checkface);
        while (checkface.sh != bdedges[i].sh) {
          infaces[i] = checkface;
          spivot(infaces[i], checkface);
        }
      }
    }
  } // i

  // Create a new subface.
  makeshellface(subfaces, &(flipfaces[3]));
  setshvertices(flipfaces[3], pa, pb,pc);
  setshellmark(flipfaces[3], shellmark(flipfaces[0]));
  if (checkconstraints) {
    //area = areabound(flipfaces[0]);
    setareabound(flipfaces[3], areabound(flipfaces[0]));
  }
  if (useinsertradius) {
    setfacetindex(flipfaces[3], getfacetindex(flipfaces[0]));
  }

  // Update the point-to-subface map.
  if (pointtype(pa) == FREEFACETVERTEX) {
    setpoint2sh(pa, sencode(flipfaces[3]));
  }
  if (pointtype(pb) == FREEFACETVERTEX) {
    setpoint2sh(pb, sencode(flipfaces[3]));
  }
  if (pointtype(pc) == FREEFACETVERTEX) {
    setpoint2sh(pc, sencode(flipfaces[3]));
  }

  // Update the three new boundary edges.
  bdedges[0] = flipfaces[3];         // [a,b]
  senext(flipfaces[3], bdedges[1]);  // [b,c]
  senext2(flipfaces[3], bdedges[2]); // [c,a]

  // Reconnect boundary edges to outer boundary faces.
  for (i = 0; i < 3; i++) {
    if (outfaces[i].sh != NULL) {
      // Make sure that the subface has the ori as the segment.
      if (bdsegs[i].sh != NULL) {
        bdsegs[i].shver = 0;
        if (sorg(bdedges[i]) != sorg(bdsegs[i])) {
          sesymself(bdedges[i]);
        }
      }
      sbond1(bdedges[i], outfaces[i]);
      sbond1(infaces[i], bdedges[i]);
    }
    if (bdsegs[i].sh != NULL) {
      ssbond(bdedges[i], bdsegs[i]);
    }
  }

  recentsh = flipfaces[3];

  if (flipflag) {
    // Put the boundary edges into flip stack.
    for (i = 0; i < 3; i++) {
      flipshpush(&(bdedges[i]));
    }
  }
}